

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5PorterGobbleVC(char *zStem,int nStem,int bPrevCons)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  int bCons;
  char *pcVar4;
  byte bVar5;
  bool bVar6;
  
  if (nStem < 1) {
    uVar3 = 0;
  }
  else {
    bVar6 = bPrevCons == 0;
    uVar3 = 0;
    do {
      bVar5 = zStem[uVar3] + 0x9f;
      bVar5 = bVar5 >> 1 | bVar5 * -0x80;
      if (((bVar5 < 0xb) && ((0x495U >> (bVar5 & 0x1f) & 1) != 0)) ||
         ((bool)(~bVar6 & zStem[uVar3] == 'y'))) {
        bPrevCons = 0;
        goto LAB_001b2399;
      }
      uVar3 = uVar3 + 1;
      bVar6 = false;
    } while ((uint)nStem != uVar3);
    bPrevCons = 1;
    uVar3 = (ulong)(uint)nStem;
  }
LAB_001b2399:
  if ((int)uVar3 + 1 < nStem) {
    bVar6 = bPrevCons != 0;
    pcVar4 = zStem + (uVar3 & 0xffffffff);
    iVar2 = (int)uVar3 + 2;
    do {
      pcVar4 = pcVar4 + 1;
      bVar5 = *pcVar4 + 0x9f;
      bVar5 = bVar5 >> 1 | bVar5 * -0x80;
      if (((10 < bVar5) || ((0x495U >> (bVar5 & 0x1f) & 1) == 0)) &&
         ((bool)(~bVar6 & 1) || *pcVar4 != 'y')) {
        return iVar2;
      }
      bVar6 = false;
      bVar1 = iVar2 < nStem;
      iVar2 = iVar2 + 1;
    } while (bVar1);
  }
  return 0;
}

Assistant:

static int fts5PorterGobbleVC(char *zStem, int nStem, int bPrevCons){
  int i;
  int bCons = bPrevCons;

  /* Scan for a vowel */
  for(i=0; i<nStem; i++){
    if( 0==(bCons = !fts5PorterIsVowel(zStem[i], bCons)) ) break;
  }

  /* Scan for a consonent */
  for(i++; i<nStem; i++){
    if( (bCons = !fts5PorterIsVowel(zStem[i], bCons)) ) return i+1;
  }
  return 0;
}